

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O3

void Q_Constr(QMatrix *Q,char *Name,size_t Dim,Boolean Symmetry,ElOrderType ElOrder,
             InstanceType Instance,Boolean OwnData)

{
  LASErrIdType LVar1;
  size_t sVar2;
  char *__dest;
  size_t *psVar3;
  ElType **ppEVar4;
  Boolean *pBVar5;
  Boolean *pBVar6;
  ElType **ppEVar7;
  Boolean *pBVar8;
  Real *pRVar9;
  Boolean *pBVar10;
  QMatrixType *pQVar11;
  ulong uVar12;
  Boolean BVar13;
  int iVar14;
  undefined1 auVar15 [16];
  
  BVar13 = Symmetry;
  sVar2 = strlen(Name);
  __dest = (char *)malloc(sVar2 + 1);
  Q->Name = __dest;
  if (__dest == (char *)0x0) {
    BVar13 = False;
    LASError(LASMemAllocErr,"Q_Constr",Name,(char *)0x0,(char *)0x0);
  }
  else {
    strcpy(__dest,Name);
  }
  Q->Dim = Dim;
  Q->Symmetry = Symmetry;
  Q->ElOrder = ElOrder;
  Q->Instance = Instance;
  Q->LockLevel = 0;
  Q->MultiplD = 1.0;
  Q->MultiplU = 1.0;
  Q->MultiplL = 1.0;
  Q->OwnData = OwnData;
  if (OwnData != False) {
    LVar1 = LASResult();
    if (LVar1 == LASOK) {
      sVar2 = Dim * 8 + 8;
      psVar3 = (size_t *)malloc(sVar2);
      Q->Len = psVar3;
      ppEVar4 = (ElType **)malloc(sVar2);
      Q->El = ppEVar4;
      pBVar5 = (Boolean *)malloc(4);
      Q->ElSorted = pBVar5;
      pBVar6 = (Boolean *)malloc(4);
      Q->DiagElAlloc = pBVar6;
      ppEVar7 = (ElType **)malloc(sVar2);
      Q->DiagEl = ppEVar7;
      pBVar8 = (Boolean *)malloc(4);
      Q->ZeroInDiag = pBVar8;
      pRVar9 = (Real *)malloc(sVar2);
      Q->InvDiagEl = pRVar9;
      pBVar10 = (Boolean *)malloc(4);
      Q->ILUExists = pBVar10;
      pQVar11 = (QMatrixType *)malloc(0xb0);
      Q->ILU = pQVar11;
      auVar15._0_4_ = -(uint)((int)((ulong)psVar3 >> 0x20) == 0 && (int)psVar3 == 0);
      auVar15._4_4_ = -(uint)((int)ppEVar4 == 0 && (int)((ulong)ppEVar4 >> 0x20) == 0);
      auVar15._8_4_ = -(uint)((int)pBVar5 == 0 && (int)((ulong)pBVar5 >> 0x20) == 0);
      auVar15._12_4_ = -(uint)((int)((ulong)pBVar6 >> 0x20) == 0 && (int)pBVar6 == 0);
      iVar14 = movmskps(BVar13,auVar15);
      if ((((iVar14 == 0) && (ppEVar7 != (ElType **)0x0)) && (pBVar8 != (Boolean *)0x0)) &&
         ((pRVar9 != (Real *)0x0 && (pQVar11 != (QMatrixType *)0x0 && pBVar10 != (Boolean *)0x0))))
      {
        if (Dim != 0) {
          uVar12 = 1;
          do {
            Q->Len[uVar12] = 0;
            Q->El[uVar12] = (ElType *)0x0;
            Q->DiagEl[uVar12] = (ElType *)0x0;
            Q->InvDiagEl[uVar12] = 0.0;
            uVar12 = uVar12 + 1;
          } while (uVar12 <= Dim);
          pBVar5 = Q->ElSorted;
          pBVar6 = Q->DiagElAlloc;
          pBVar8 = Q->ZeroInDiag;
          pBVar10 = Q->ILUExists;
        }
        *pBVar5 = False;
        *pBVar6 = False;
        *pBVar8 = True;
        *pBVar10 = False;
      }
      else {
        LASError(LASMemAllocErr,"Q_Constr",Name,(char *)0x0,(char *)0x0);
      }
    }
    else {
      Q->DiagEl = (ElType **)0x0;
      Q->ZeroInDiag = (Boolean *)0x0;
      Q->ElSorted = (Boolean *)0x0;
      Q->DiagElAlloc = (Boolean *)0x0;
      Q->Len = (size_t *)0x0;
      Q->El = (ElType **)0x0;
      Q->InvDiagEl = (Real *)0x0;
      Q->ILUExists = (Boolean *)0x0;
      Q->ILU = (QMatrixType *)0x0;
    }
  }
  Q->UnitRightKer = False;
  Q->RightKerCmp = (Real *)0x0;
  Q->UnitLeftKer = False;
  Q->LeftKerCmp = (Real *)0x0;
  Q->EigenvalInfo = (void *)0x0;
  return;
}

Assistant:

void Q_Constr(QMatrix *Q, char *Name, size_t Dim, Boolean Symmetry,
              ElOrderType ElOrder, InstanceType Instance, Boolean OwnData)
/* constructor of the type QMatrix */
{
    size_t RoC;

    Q->Name = (char *)malloc((strlen(Name) + 1) * sizeof(char));
    if (Q->Name != NULL)
        strcpy(Q->Name, Name);
    else
        LASError(LASMemAllocErr, "Q_Constr", Name, NULL, NULL);
    Q->Dim = Dim;
    Q->Symmetry = Symmetry;
    Q->ElOrder = ElOrder;
    Q->Instance = Instance;
    Q->LockLevel = 0;
    Q->MultiplD = 1.0;
    Q->MultiplU = 1.0;
    Q->MultiplL = 1.0;
    Q->OwnData = OwnData;
    if (OwnData) {
        if (LASResult() == LASOK) {
	    Q->Len = (size_t *)malloc((Dim + 1) * sizeof(size_t));
	    Q->El = (ElType **)malloc((Dim + 1) * sizeof(ElType *));
	    Q->ElSorted = (Boolean *)malloc(sizeof(Boolean));
	    Q->DiagElAlloc = (Boolean *)malloc(sizeof(Boolean));
	    Q->DiagEl = (ElType **)malloc((Dim + 1) * sizeof(ElType *));
	    Q->ZeroInDiag = (Boolean *)malloc(sizeof(Boolean));
            Q->InvDiagEl = (Real *)malloc((Dim + 1) * sizeof(Real));
	    Q->ILUExists = (Boolean *)malloc(sizeof(Boolean));
            Q->ILU = (QMatrix *)malloc(sizeof(QMatrix));
	    if (Q->Len != NULL && Q->El != NULL && Q->ElSorted != NULL
	        && Q->DiagElAlloc != NULL && Q->DiagEl != NULL && Q->ZeroInDiag != NULL
	        && Q->InvDiagEl != NULL && Q->ILUExists != NULL && Q->ILU != NULL) {
                for (RoC = 1; RoC <= Dim; RoC++) {
                    Q->Len[RoC] = 0;
                    Q->El[RoC] = NULL;
                    Q->DiagEl[RoC] = NULL;
                    Q->InvDiagEl[RoC] = 0.0;
                }
                *Q->ElSorted = False;
                *Q->DiagElAlloc = False;
                *Q->ZeroInDiag = True;
                *Q->ILUExists = False;
            } else {
	        LASError(LASMemAllocErr, "Q_Constr", Name, NULL, NULL);
            }
        } else {
	    Q->Len = NULL;
	    Q->El = NULL;
	    Q->ElSorted = NULL;
	    Q->DiagElAlloc = NULL;
	    Q->DiagEl = NULL;
	    Q->ZeroInDiag = NULL;
            Q->InvDiagEl = NULL;
	    Q->ILUExists = NULL;
	    Q->ILU = NULL;
        }
    }
    Q->UnitRightKer = False;
    Q->RightKerCmp = NULL;
    Q->UnitLeftKer = False;
    Q->LeftKerCmp = NULL;
    Q->EigenvalInfo = NULL;
}